

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O2

lzham_compress_status_t
lzham::create_internal_init_params(init_params *internal_params,lzham_compress_params *pParams)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  lzham_compress_status_t lVar4;
  
  lVar4 = LZHAM_COMP_STATUS_INVALID_PARAMETER;
  if ((0xfffffff0 < pParams->m_dict_size_log2 - 0x1e) &&
     (uVar1 = pParams->m_extreme_parsing_max_best_arrivals, uVar1 < 9)) {
    uVar3 = 4;
    if (1 < uVar1) {
      uVar3 = uVar1;
    }
    internal_params->m_extreme_parsing_max_best_arrivals = uVar3;
    uVar1 = pParams->m_fast_bytes;
    if (uVar1 != 0) {
      uVar3 = 0x102;
      if (uVar1 < 0x102) {
        uVar3 = uVar1;
      }
      uVar1 = 8;
      if (8 < uVar3) {
        uVar1 = uVar3;
      }
      internal_params->m_fast_bytes_override = uVar1;
    }
    internal_params->m_dict_size_log2 = pParams->m_dict_size_log2;
    uVar1 = pParams->m_max_helper_threads;
    if ((int)uVar1 < 0) {
      uVar1 = lzham_get_max_helper_threads();
    }
    uVar3 = 0x40;
    if (uVar1 < 0x40) {
      uVar3 = uVar1;
    }
    internal_params->m_max_helper_threads = uVar3;
    internal_params->m_lzham_compress_flags = pParams->m_compress_flags;
    uVar1 = pParams->m_num_seed_bytes;
    if (uVar1 != 0) {
      if (pParams->m_pSeed_bytes == (void *)0x0) {
        return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }
      if ((uint)(1 << ((byte)pParams->m_dict_size_log2 & 0x1f)) < uVar1) {
        return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }
      internal_params->m_num_seed_bytes = uVar1;
      internal_params->m_pSeed_bytes = pParams->m_pSeed_bytes;
    }
    if (pParams->m_level < cCompressionLevelCount) {
      internal_params->m_compression_level = pParams->m_level;
      if ((pParams->m_table_max_update_interval == 0) &&
         (pParams->m_table_update_interval_slow_rate == 0)) {
        uVar1 = pParams->m_table_update_rate;
        uVar3 = 0x14;
        if (uVar1 < 0x14) {
          uVar3 = uVar1;
        }
        uVar2 = 7;
        if (uVar1 != 0) {
          uVar2 = (ulong)(uVar3 - 1);
        }
        internal_params->m_table_max_update_interval =
             (uint)*(ushort *)((long)&g_table_update_settings + uVar2 * 4);
        uVar1 = (uint)*(ushort *)((long)&g_table_update_settings + uVar2 * 4 + 2);
      }
      else {
        internal_params->m_table_max_update_interval = pParams->m_table_max_update_interval;
        uVar1 = pParams->m_table_update_interval_slow_rate;
      }
      internal_params->m_table_update_interval_slow_rate = uVar1;
      lVar4 = LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE;
    }
  }
  return lVar4;
}

Assistant:

static lzham_compress_status_t create_internal_init_params(lzcompressor::init_params &internal_params, const lzham_compress_params *pParams)
   {
      if ((pParams->m_dict_size_log2 < CLZBase::cMinDictSizeLog2) || (pParams->m_dict_size_log2 > CLZBase::cMaxDictSizeLog2))
      {
         LZHAM_LOG_ERROR(6000);
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }
      
      if (pParams->m_extreme_parsing_max_best_arrivals > cMaxParseNodeStates)
      {
         LZHAM_LOG_ERROR(6001);
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }
      
      if (pParams->m_extreme_parsing_max_best_arrivals <= 1)
         internal_params.m_extreme_parsing_max_best_arrivals = cDefaultMaxParseNodeStates;
      else
         internal_params.m_extreme_parsing_max_best_arrivals = pParams->m_extreme_parsing_max_best_arrivals;			     

      if (pParams->m_fast_bytes > 0)
         internal_params.m_fast_bytes_override = math::clamp<uint>(pParams->m_fast_bytes, LZHAM_MIN_FAST_BYTES, LZHAM_MAX_FAST_BYTES);

      internal_params.m_dict_size_log2 = pParams->m_dict_size_log2;
      
      if (pParams->m_max_helper_threads < 0)
         internal_params.m_max_helper_threads = lzham_get_max_helper_threads();
      else
         internal_params.m_max_helper_threads = pParams->m_max_helper_threads;
      internal_params.m_max_helper_threads = LZHAM_MIN(LZHAM_MAX_HELPER_THREADS, internal_params.m_max_helper_threads);

      internal_params.m_lzham_compress_flags = pParams->m_compress_flags;

      if (pParams->m_num_seed_bytes)
      {
         if ((!pParams->m_pSeed_bytes) || (pParams->m_num_seed_bytes > (1U << pParams->m_dict_size_log2)))
         {
            LZHAM_LOG_ERROR(6002);
            return LZHAM_COMP_STATUS_INVALID_PARAMETER;
         }

         internal_params.m_num_seed_bytes = pParams->m_num_seed_bytes;
         internal_params.m_pSeed_bytes = pParams->m_pSeed_bytes;
      }

      switch (pParams->m_level)
      {
         case LZHAM_COMP_LEVEL_FASTEST:   internal_params.m_compression_level = cCompressionLevelFastest; break;
         case LZHAM_COMP_LEVEL_FASTER:    internal_params.m_compression_level = cCompressionLevelFaster; break;
         case LZHAM_COMP_LEVEL_DEFAULT:   internal_params.m_compression_level = cCompressionLevelDefault; break;
         case LZHAM_COMP_LEVEL_BETTER:    internal_params.m_compression_level = cCompressionLevelBetter; break;
         case LZHAM_COMP_LEVEL_UBER:      internal_params.m_compression_level = cCompressionLevelUber; break;
         default:
            LZHAM_LOG_ERROR(6003);
            return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      };

		if (pParams->m_table_max_update_interval || pParams->m_table_update_interval_slow_rate)
		{
			internal_params.m_table_max_update_interval = pParams->m_table_max_update_interval;
			internal_params.m_table_update_interval_slow_rate = pParams->m_table_update_interval_slow_rate;
		}
		else 
		{
			uint rate = pParams->m_table_update_rate;
			if (!rate)
				rate = LZHAM_DEFAULT_TABLE_UPDATE_RATE;
			rate = math::clamp<uint>(rate, 1, LZHAM_FASTEST_TABLE_UPDATE_RATE) - 1;
			internal_params.m_table_max_update_interval = g_table_update_settings[rate].m_max_update_interval;
			internal_params.m_table_update_interval_slow_rate = g_table_update_settings[rate].m_slow_rate;
		}

      return LZHAM_COMP_STATUS_SUCCESS;
   }